

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O3

MMDB_entry_data_list_s * test_utf8_string_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  MMDB_entry_data_s entry_data;
  char *got;
  char expect [19];
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined3 in_stack_ffffffffffffffd8;
  undefined5 in_stack_ffffffffffffffdb;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x139,(pMVar1->entry_data).type,"==",2,"\'utf8_string\' key\'s value is a string",0
               );
  uVar2 = *(undefined8 *)&pMVar1->entry_data;
  uVar3 = *(undefined8 *)&(pMVar1->entry_data).field_0x8;
  pcVar4 = (pMVar1->entry_data).field_1.utf8_string;
  entry_data.field_1.uint128._8_4_ = in_stack_ffffffffffffffc8;
  entry_data._0_24_ = *(undefined1 (*) [24])((long)&(pMVar1->entry_data).field_1 + 8);
  entry_data.field_1.uint128._12_4_ = in_stack_ffffffffffffffcc;
  entry_data.offset = in_stack_ffffffffffffffd0;
  entry_data.offset_to_next = in_stack_ffffffffffffffd4;
  entry_data.data_size._0_3_ = in_stack_ffffffffffffffd8;
  entry_data._43_5_ = in_stack_ffffffffffffffdb;
  got = dup_entry_string_or_bail(entry_data);
  is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
            ,0x150,got,&stack0xffffffffffffffc8,"got expected value for utf8_string key",0,uVar2,
            uVar3,pcVar4);
  free(got);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_utf8_string_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UTF8_STRING,
           "'utf8_string' key's value is a string");
    char *utf8_string = dup_entry_string_or_bail(value->entry_data);
    // This is hex for "unicode! ☯ - ♫" as bytes
    char expect[19] = {0x75,
                       0x6e,
                       0x69,
                       0x63,
                       0x6f,
                       0x64,
                       0x65,
                       0x21,
                       0x20,
                       (char)0xe2,
                       (char)0x98,
                       (char)0xaf,
                       0x20,
                       0x2d,
                       0x20,
                       (char)0xe2,
                       (char)0x99,
                       (char)0xab,
                       0x00};

    is(utf8_string, expect, "got expected value for utf8_string key");

    free(utf8_string);

    return entry_data_list;
}